

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O1

void Aig_ManPackSetRandom(Aig_ManPack_t *p)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  if (0 < p->pAig->vCis->nSize) {
    lVar3 = 0;
    do {
      uVar1 = Aig_ManRandom(0);
      uVar2 = Aig_ManRandom(0);
      if (p->vPiPats->nSize <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                      ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
      }
      p->vPiPats->pArray[lVar3] = ((ulong)uVar1 << 0x21) + (ulong)uVar2 * 2;
      lVar3 = lVar3 + 1;
    } while (lVar3 < p->pAig->vCis->nSize);
  }
  return;
}

Assistant:

void Aig_ManPackSetRandom( Aig_ManPack_t * p )
{
    Aig_Obj_t * pObj;
    word Sign;
    int i;
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        Sign = (((word)Aig_ManRandom(0)) << 32) | ((word)Aig_ManRandom(0));
        Vec_WrdWriteEntry( p->vPiPats, i, Sign << 1 );
    }
}